

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::handleTransformations(QPDFJob *this,QPDF *pdf)

{
  qpdf_page_label_e start_num;
  uint uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  reference pQVar6;
  element_type *afdh_00;
  runtime_error *prVar7;
  string_view prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  anon_class_8_1_ba1d59bf local_3f0;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3e8;
  reference local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  iterator __end2_5;
  iterator __begin2_5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_5;
  QPDFEmbeddedFileDocumentHelper efdh;
  string local_380;
  QPDFObjectHandle local_360;
  allocator<char> local_349;
  string local_348;
  undefined1 local_328 [8];
  QPDFObjectHandle page_labels;
  QPDFObjectHandle local_308;
  QPDFObjectHandle local_2f8;
  undefined1 local_2e1;
  string local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  reference local_220;
  PageLabelSpec *spec;
  iterator __end2_4;
  iterator __begin2_4;
  vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_> *__range2_4;
  undefined1 local_1f8 [4];
  int last_page_seen;
  size_type local_1e0;
  int local_1d4;
  undefined1 local_1d0 [4];
  int n_pages;
  QPDFObjectHandle nums;
  string local_1b8;
  QPDFObjectHandle local_198;
  reference local_188;
  QPDFPageObjectHelper *page_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range2_3;
  QPDFPageObjectHelper *page;
  iterator __end2_2;
  iterator __begin2_2;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range2_2;
  int local_110;
  QPDF *local_108;
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_100;
  reference local_e0;
  QPDFPageObjectHelper *ph_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range2_1;
  int pageno;
  QPDFPageObjectHelper *ph;
  iterator __end2;
  iterator __begin2;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range2;
  undefined1 local_58 [8];
  anon_class_16_2_622ee4b4 make_afdh;
  shared_ptr<QPDFAcroFormDocumentHelper> afdh;
  QPDFPageDocumentHelper dh;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pdf);
  std::shared_ptr<QPDFAcroFormDocumentHelper>::shared_ptr
            ((shared_ptr<QPDFAcroFormDocumentHelper> *)&make_afdh.pdf);
  local_58 = (undefined1  [8])&make_afdh.pdf;
  make_afdh.afdh = (shared_ptr<QPDFAcroFormDocumentHelper> *)pdf;
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar4->remove_restrictions & 1U) != 0) {
    handleTransformations::anon_class_16_2_622ee4b4::operator()
              ((anon_class_16_2_622ee4b4 *)local_58);
    peVar5 = std::
             __shared_ptr_access<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&make_afdh.pdf);
    QPDFAcroFormDocumentHelper::disableDigitalSignatures(peVar5);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (((peVar4->externalize_inline_images & 1U) != 0) ||
     ((peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this), (peVar4->optimize_images & 1U) != 0 &&
      (peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this), (peVar4->keep_inline_images & 1U) == 0)))) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2,
               (QPDFPageDocumentHelper *)
               &afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __end2 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                       ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                        &__begin2);
    ph = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end
                   ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2
                   );
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                       *)&ph), bVar2) {
      pQVar6 = __gnu_cxx::
               __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
               ::operator*(&__end2);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFPageObjectHelper::externalizeInlineImages(pQVar6,peVar4->ii_min_bytes,false);
      __gnu_cxx::
      __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
      ::operator++(&__end2);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar4->optimize_images & 1U) != 0) {
    __range2_1._4_4_ = 0;
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2_1,
               (QPDFPageDocumentHelper *)
               &afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __end2_1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                         ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                          &__begin2_1);
    ph_1 = (QPDFPageObjectHelper *)
           std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end
                     ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                      &__begin2_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                               *)&ph_1), bVar2) {
      pQVar6 = __gnu_cxx::
               __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
               ::operator*(&__end2_1);
      __range2_1._4_4_ = __range2_1._4_4_ + 1;
      __range2_2 = (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)this;
      local_110 = __range2_1._4_4_;
      local_108 = pdf;
      local_e0 = pQVar6;
      std::function<void(QPDFObjectHandle&,QPDFObjectHandle&,std::__cxx11::string_const&)>::
      function<QPDFJob::handleTransformations(QPDF&)::__0,void>
                ((function<void(QPDFObjectHandle&,QPDFObjectHandle&,std::__cxx11::string_const&)> *)
                 &local_100,(anon_class_24_3_1e6c7da7 *)&__range2_2);
      QPDFPageObjectHelper::forEachImage(pQVar6,true,&local_100);
      std::
      function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_100);
      __gnu_cxx::
      __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2_1);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar4->generate_appearances & 1U) != 0) {
    handleTransformations::anon_class_16_2_622ee4b4::operator()
              ((anon_class_16_2_622ee4b4 *)local_58);
    peVar5 = std::
             __shared_ptr_access<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&make_afdh.pdf);
    QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded(peVar5);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar4->flatten_annotations & 1U) != 0) {
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar3 = peVar4->flatten_annotations_required;
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFPageDocumentHelper::flattenAnnotations
              ((QPDFPageDocumentHelper *)
               &afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,iVar3,peVar4->flatten_annotations_forbidden);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar4->coalesce_contents & 1U) != 0) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2_2,
               (QPDFPageDocumentHelper *)
               &afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __end2_2 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                         ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                          &__begin2_2);
    page = (QPDFPageObjectHelper *)
           std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end
                     ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                      &__begin2_2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                               *)&page), bVar2) {
      pQVar6 = __gnu_cxx::
               __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
               ::operator*(&__end2_2);
      QPDFPageObjectHelper::coalesceContentStreams(pQVar6);
      __gnu_cxx::
      __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
      ::operator++(&__end2_2);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2_2);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar4->flatten_rotation & 1U) != 0) {
    handleTransformations::anon_class_16_2_622ee4b4::operator()
              ((anon_class_16_2_622ee4b4 *)local_58);
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2_3,
               (QPDFPageDocumentHelper *)
               &afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __end2_3 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                         ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                          &__begin2_3);
    page_1 = (QPDFPageObjectHelper *)
             std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end
                       ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                        &__begin2_3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                               *)&page_1), bVar2) {
      pQVar6 = __gnu_cxx::
               __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
               ::operator*(&__end2_3);
      local_188 = pQVar6;
      afdh_00 = std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)
                           &make_afdh.pdf);
      QPDFPageObjectHelper::flattenRotation(pQVar6,afdh_00);
      __gnu_cxx::
      __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
      ::operator++(&__end2_3);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin2_3);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar4->remove_page_labels & 1U) != 0) {
    QPDF::getRoot((QPDF *)&local_198);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"/PageLabels",
               (allocator<char> *)
               ((long)&nums.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::removeKey(&local_198,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&nums.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::~QPDFObjectHandle(&local_198);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar2 = std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>::empty
                    (&peVar4->page_label_specs);
  if (!bVar2) {
    QPDFObjectHandle::newArray();
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_1f8,
               (QPDFPageDocumentHelper *)
               &afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_1e0 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                          ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                           local_1f8);
    iVar3 = QIntC::to_int<unsigned_long>(&local_1e0);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_1f8);
    __range2_4._4_4_ = 0;
    local_1d4 = iVar3;
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    __end2_4 = std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>::begin
                         (&peVar4->page_label_specs);
    spec = (PageLabelSpec *)
           std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>::end
                     (&peVar4->page_label_specs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<QPDFJob::PageLabelSpec_*,_std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>_>
                               *)&spec), bVar2) {
      local_220 = __gnu_cxx::
                  __normal_iterator<QPDFJob::PageLabelSpec_*,_std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>_>
                  ::operator*(&__end2_4);
      if (local_220->first_page < 0) {
        local_220->first_page = local_1d4 + 1 + local_220->first_page;
      }
      if (__range2_4._4_4_ == 0) {
        if (local_220->first_page != 1) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar7,"the first page label specification must start with page 1");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else if (local_220->first_page <= __range2_4._4_4_) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar7,"page label specifications must be in order by first page");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_1d4 < local_220->first_page) {
        local_2e1 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_2c0,local_220->first_page);
        std::operator+(&local_2a0,"page label spec: page ",&local_2c0);
        std::operator+(&local_280,&local_2a0," is more than the total number of pages (");
        std::__cxx11::to_string(&local_2e0,local_1d4);
        std::operator+(&local_260,&local_280,&local_2e0);
        std::operator+(&local_240,&local_260,")");
        std::runtime_error::runtime_error(prVar7,(string *)&local_240);
        local_2e1 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __range2_4._4_4_ = local_220->first_page;
      QPDFObjectHandle::newInteger(&local_2f8,(long)(local_220->first_page + -1));
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_1d0,&local_2f8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_2f8);
      start_num = local_220->label_type;
      uVar1 = local_220->start_num;
      page_labels.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_220->prefix);
      prefix._M_len = (ulong)uVar1;
      prefix._M_str =
           (char *)page_labels.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      QPDFPageLabelDocumentHelper::pageLabelDict((qpdf_page_label_e)&local_308,start_num,prefix);
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_1d0,&local_308);
      QPDFObjectHandle::~QPDFObjectHandle(&local_308);
      __gnu_cxx::
      __normal_iterator<QPDFJob::PageLabelSpec_*,_std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>_>
      ::operator++(&__end2_4);
    }
    QPDFObjectHandle::newDictionary();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"/Nums",&local_349);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_328,&local_348,(QPDFObjectHandle *)local_1d0);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    QPDF::getRoot((QPDF *)&local_360);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"/PageLabels",
               (allocator<char> *)
               ((long)&efdh.m.
                       super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    QPDFObjectHandle::replaceKey(&local_360,&local_380,(QPDFObjectHandle *)local_328);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&efdh.m.
                       super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    QPDFObjectHandle::~QPDFObjectHandle(&local_360);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_328);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1d0);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar2 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&peVar4->attachments_to_remove);
  if (!bVar2) {
    QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
              ((QPDFEmbeddedFileDocumentHelper *)&__range2_5,pdf);
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    __end2_5 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&peVar4->attachments_to_remove);
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&peVar4->attachments_to_remove);
    while (bVar2 = std::operator!=(&__end2_5,(_Self *)&key), bVar2) {
      local_3c8 = std::
                  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2_5);
      bVar2 = QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile
                        ((QPDFEmbeddedFileDocumentHelper *)&__range2_5,local_3c8);
      if (!bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_430,"attachment ",local_3c8);
        std::operator+(&local_410,&local_430," not found");
        std::runtime_error::runtime_error(prVar7,(string *)&local_410);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_3f0.key = local_3c8;
      std::function<void(Pipeline&,std::__cxx11::string_const&)>::
      function<QPDFJob::handleTransformations(QPDF&)::__1,void>
                ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_3e8,&local_3f0);
      doIfVerbose(this,&local_3e8);
      std::
      function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_3e8);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_5);
    }
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
              ((QPDFEmbeddedFileDocumentHelper *)&__range2_5);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar2 = std::__cxx11::list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>::empty
                    (&peVar4->attachments_to_add);
  if (!bVar2) {
    addAttachments(this,pdf);
  }
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar2 = std::__cxx11::
          list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>::empty
                    (&peVar4->attachments_to_copy);
  if (!bVar2) {
    copyAttachments(this,pdf);
  }
  std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr
            ((shared_ptr<QPDFAcroFormDocumentHelper> *)&make_afdh.pdf);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &afdh.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFJob::handleTransformations(QPDF& pdf)
{
    QPDFPageDocumentHelper dh(pdf);
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdh;
    auto make_afdh = [&]() {
        if (!afdh.get()) {
            afdh = std::make_shared<QPDFAcroFormDocumentHelper>(pdf);
        }
    };
    if (m->remove_restrictions) {
        make_afdh();
        afdh->disableDigitalSignatures();
    }
    if (m->externalize_inline_images || (m->optimize_images && (!m->keep_inline_images))) {
        for (auto& ph: dh.getAllPages()) {
            ph.externalizeInlineImages(m->ii_min_bytes);
        }
    }
    if (m->optimize_images) {
        int pageno = 0;
        for (auto& ph: dh.getAllPages()) {
            ++pageno;
            ph.forEachImage(
                true,
                [this, pageno, &pdf](
                    QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key) {
                    auto io = std::make_unique<ImageOptimizer>(
                        *this,
                        m->oi_min_width,
                        m->oi_min_height,
                        m->oi_min_area,
                        m->jpeg_quality,
                        obj);
                    if (io->evaluate("image " + key + " on page " + std::to_string(pageno))) {
                        QPDFObjectHandle new_image = pdf.newStream();
                        new_image.replaceDict(obj.getDict().shallowCopy());
                        new_image.replaceStreamData(
                            std::move(io),
                            QPDFObjectHandle::newName("/DCTDecode"),
                            QPDFObjectHandle::newNull());
                        xobj_dict.replaceKey(key, new_image);
                    }
                });
        }
    }
    if (m->generate_appearances) {
        make_afdh();
        afdh->generateAppearancesIfNeeded();
    }
    if (m->flatten_annotations) {
        dh.flattenAnnotations(m->flatten_annotations_required, m->flatten_annotations_forbidden);
    }
    if (m->coalesce_contents) {
        for (auto& page: dh.getAllPages()) {
            page.coalesceContentStreams();
        }
    }
    if (m->flatten_rotation) {
        make_afdh();
        for (auto& page: dh.getAllPages()) {
            page.flattenRotation(afdh.get());
        }
    }
    if (m->remove_page_labels) {
        pdf.getRoot().removeKey("/PageLabels");
    }
    if (!m->page_label_specs.empty()) {
        auto nums = QPDFObjectHandle::newArray();
        auto n_pages = QIntC::to_int(dh.getAllPages().size());
        int last_page_seen{0};
        for (auto& spec: m->page_label_specs) {
            if (spec.first_page < 0) {
                spec.first_page = n_pages + 1 + spec.first_page;
            }
            if (last_page_seen == 0) {
                if (spec.first_page != 1) {
                    throw std::runtime_error(
                        "the first page label specification must start with page 1");
                }
            } else if (spec.first_page <= last_page_seen) {
                throw std::runtime_error(
                    "page label specifications must be in order by first page");
            }
            if (spec.first_page > n_pages) {
                throw std::runtime_error(
                    "page label spec: page " + std::to_string(spec.first_page) +
                    " is more than the total number of pages (" + std::to_string(n_pages) + ")");
            }
            last_page_seen = spec.first_page;
            nums.appendItem(QPDFObjectHandle::newInteger(spec.first_page - 1));
            nums.appendItem(
                QPDFPageLabelDocumentHelper::pageLabelDict(
                    spec.label_type, spec.start_num, spec.prefix));
        }
        auto page_labels = QPDFObjectHandle::newDictionary();
        page_labels.replaceKey("/Nums", nums);
        pdf.getRoot().replaceKey("/PageLabels", page_labels);
    }
    if (!m->attachments_to_remove.empty()) {
        QPDFEmbeddedFileDocumentHelper efdh(pdf);
        for (auto const& key: m->attachments_to_remove) {
            if (efdh.removeEmbeddedFile(key)) {
                doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                    v << prefix << ": removed attachment " << key << "\n";
                });
            } else {
                throw std::runtime_error("attachment " + key + " not found");
            }
        }
    }
    if (!m->attachments_to_add.empty()) {
        addAttachments(pdf);
    }
    if (!m->attachments_to_copy.empty()) {
        copyAttachments(pdf);
    }
}